

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void __thiscall
kratos::VarException::VarException(VarException *this,string *message,iterator begin,iterator end)

{
  bool bVar1;
  reference ppVVar2;
  __normal_iterator<const_kratos::Var_**,_std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>_>
  local_30;
  iterator it;
  string *message_local;
  VarException *this_local;
  iterator end_local;
  iterator begin_local;
  
  it._M_current = (Var **)message;
  this_local = (VarException *)end._M_current;
  end_local = begin;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__VarException_005a8000;
  local_30._M_current = end_local._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_kratos::Var_**,_std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>_>
                        *)&this_local);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_kratos::Var_**,_std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>_>
              ::operator*(&local_30);
    print_ast_node(&(*ppVVar2)->super_IRNode);
    __gnu_cxx::
    __normal_iterator<const_kratos::Var_**,_std::vector<const_kratos::Var_*,_std::allocator<const_kratos::Var_*>_>_>
    ::operator++(&local_30,0);
  }
  return;
}

Assistant:

VarException::VarException(const std::string& message, std::vector<const Var*>::iterator begin,
                           std::vector<const Var*>::iterator end) noexcept
    : std::runtime_error(message) {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}